

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O1

MoveData * __thiscall
Rml::ElementHandleTargetData::GetMoveData
          (MoveData *__return_storage_ptr__,ElementHandleTargetData *this,Vector2f *drag_delta_min,
          Vector2f *drag_delta_max)

{
  Vector2f VVar1;
  Vector2f VVar2;
  CommonValues CVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float local_58;
  float fStack_54;
  float local_48;
  
  (__return_storage_ptr__->original_position_top_left).x = 0.0;
  (__return_storage_ptr__->original_position_top_left).y = 0.0;
  (__return_storage_ptr__->original_position_bottom_right).x = 0.0;
  (__return_storage_ptr__->original_position_bottom_right).y = 0.0;
  (__return_storage_ptr__->top_left).x = false;
  (__return_storage_ptr__->top_left).y = false;
  (__return_storage_ptr__->bottom_right).x = false;
  (__return_storage_ptr__->bottom_right).y = false;
  fVar6 = GetPositionLeft(this);
  fVar7 = GetPositionTop(this);
  (__return_storage_ptr__->original_position_top_left).x = fVar6;
  (__return_storage_ptr__->original_position_top_left).y = fVar7;
  fVar6 = GetPositionRight(this);
  fVar7 = GetPositionBottom(this);
  (__return_storage_ptr__->original_position_bottom_right).x = fVar6;
  (__return_storage_ptr__->original_position_bottom_right).y = fVar7;
  CVar3 = this->computed->common;
  bVar4 = ((undefined1  [96])CVar3 & (undefined1  [96])0x3000000000) == (undefined1  [96])0x0;
  (__return_storage_ptr__->bottom_right).x = !bVar4;
  bVar5 = ((undefined1  [96])CVar3 & (undefined1  [96])0xc000000000) == (undefined1  [96])0x0;
  (__return_storage_ptr__->bottom_right).y = !bVar5;
  (__return_storage_ptr__->top_left).x =
       ((undefined1  [96])CVar3 & (undefined1  [96])0x30000000000) != (undefined1  [96])0x0 || bVar4
  ;
  (__return_storage_ptr__->top_left).y =
       ((undefined1  [96])CVar3 & (undefined1  [96])0xc00000000) != (undefined1  [96])0x0 || bVar5;
  VVar1 = DistanceToTopLeft(this);
  VVar2 = DistanceToBottomRight(this,VVar1);
  local_48 = VVar1.x;
  VVar1.y = (this->resolved_edge_margin)._M_elems[0] - VVar1.y;
  VVar1.x = (this->resolved_edge_margin)._M_elems[3] - local_48;
  VVar1 = Math::Max<Rml::Vector2<float>>(*drag_delta_min,VVar1);
  *drag_delta_min = VVar1;
  local_58 = VVar2.x;
  fStack_54 = VVar2.y;
  VVar2.y = fStack_54 - (this->resolved_edge_margin)._M_elems[2];
  VVar2.x = local_58 - (this->resolved_edge_margin)._M_elems[1];
  VVar1 = Math::Min<Rml::Vector2<float>>(*drag_delta_max,VVar2);
  *drag_delta_max = VVar1;
  return __return_storage_ptr__;
}

Assistant:

MoveData GetMoveData(Vector2f& drag_delta_min, Vector2f& drag_delta_max) const
	{
		using namespace Style;
		MoveData data = {};

		data.original_position_top_left = {GetPositionLeft(), GetPositionTop()};
		data.original_position_bottom_right = {GetPositionRight(), GetPositionBottom()};

		data.bottom_right.x = (computed.right().type != Right::Auto);
		data.bottom_right.y = (computed.bottom().type != Bottom::Auto);
		data.top_left.x = (!data.bottom_right.x || computed.left().type != Left::Auto);
		data.top_left.y = (!data.bottom_right.y || computed.top().type != Top::Auto);

		const Vector2f distance_to_top_left = DistanceToTopLeft();
		const Vector2f distance_to_bottom_right = DistanceToBottomRight(distance_to_top_left);

		drag_delta_min = Math::Max(drag_delta_min, Vector2f{resolved_edge_margin[LEFT], resolved_edge_margin[TOP]} - distance_to_top_left);
		drag_delta_max = Math::Min(drag_delta_max, Vector2f{-resolved_edge_margin[RIGHT], -resolved_edge_margin[BOTTOM]} + distance_to_bottom_right);

		return data;
	}